

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeDelete(BtCursor *pCur,u8 flags)

{
  ushort uVar1;
  Btree *pBtree;
  BtShared *pBt;
  MemPage *pPage;
  MemPage *pPage_00;
  u8 *pTemp;
  ulong uVar2;
  char cVar3;
  ushort uVar4;
  u16 uVar5;
  int iVar6;
  undefined4 uVar7;
  int iVar8;
  u8 *puVar9;
  uint uVar10;
  uchar *pCell;
  undefined7 in_register_00000031;
  MemPage **ppMVar11;
  long lVar12;
  int local_74;
  uint local_70;
  int local_6c;
  ulong local_68;
  Pgno local_5c;
  ulong local_58;
  long local_50;
  CellInfo info;
  
  pBtree = pCur->pBtree;
  pBt = pBtree->pBt;
  if (pCur->eState != 0) {
    if (pCur->eState < 3) {
      iVar6 = 0x139a5;
      goto LAB_00140253;
    }
    iVar6 = btreeRestoreCursorPosition(pCur);
    if (iVar6 != 0) {
      return iVar6;
    }
    if (pCur->eState != '\0') {
      return 0;
    }
  }
  uVar1 = pCur->ix;
  pPage = pCur->pPage;
  uVar4 = pPage->nCell;
  if (uVar4 <= uVar1) {
    iVar6 = 0x139ae;
LAB_00140253:
    iVar6 = sqlite3CorruptError(iVar6);
    return iVar6;
  }
  local_70 = (uint)CONCAT71(in_register_00000031,flags);
  local_6c = (int)pCur->iPage;
  puVar9 = pPage->aCellIdx;
  iVar6 = (uint)puVar9[(ulong)uVar1 * 2] << 8;
  pCell = pPage->aData +
          (CONCAT11(puVar9[(ulong)uVar1 * 2],puVar9[(ulong)uVar1 * 2 + 1]) & pPage->maskPage);
  if (pPage->nFree < 0) {
    iVar8 = btreeComputeFreeSpace(pPage);
    if (iVar8 != 0) {
      iVar6 = 0x139b2;
      goto LAB_00140253;
    }
    puVar9 = pPage->aCellIdx;
    uVar4 = pPage->nCell;
  }
  if (pCell < puVar9 + uVar4) {
    iVar6 = 0x139b5;
    goto LAB_00140253;
  }
  if ((local_70 & 2) != 0) {
    if (pPage->leaf != '\0') {
      local_68 = (ulong)(uint)pPage->nFree;
      uVar5 = (*pPage->xCellSize)(pPage,pCell);
      iVar6 = 3;
      uVar2 = (ulong)(pBt->usableSize * 2) / 3;
      if (((int)((int)local_68 + (uint)uVar5 + 2) <= (int)uVar2) &&
         (uVar7 = (undefined4)CONCAT71((int7)(uVar2 >> 8),1), pPage->nCell != 1)) goto LAB_001402c6;
    }
    local_74 = saveCursorKey(pCur);
    if (local_74 != 0) {
      return local_74;
    }
  }
  uVar7 = 0;
LAB_001402c6:
  local_68 = CONCAT44(local_68._4_4_,uVar7);
  if (((pPage->leaf != '\0') || (iVar6 = sqlite3BtreePrevious(pCur,iVar6), iVar6 == 0)) &&
     (((pCur->curFlags & 0x20) == 0 || (iVar6 = saveAllCursors(pBt,pCur->pgnoRoot,pCur), iVar6 == 0)
      ))) {
    if ((pCur->pKeyInfo == (KeyInfo *)0x0) && (pBtree->hasIncrblobCur != '\0')) {
      invalidateIncrblobCursors(pBtree,pCur->pgnoRoot,(pCur->info).nKey,0);
    }
    iVar6 = sqlite3PagerWrite(pPage->pDbPage);
    if (iVar6 == 0) {
      (*pPage->xParseCell)(pPage,pCell,&info);
      iVar6 = 0;
      if (info.nPayload != info.nLocal) {
        iVar6 = clearCellOverflow(pPage,pCell,&info);
      }
      local_74 = iVar6;
      dropCell(pPage,(uint)uVar1,(uint)info.nSize,&local_74);
      iVar6 = local_74;
      if (local_74 == 0) {
        lVar12 = (long)local_6c;
        if (pPage->leaf == '\0') {
          pPage_00 = pCur->pPage;
          local_50 = lVar12;
          if ((pPage_00->nFree < 0) && (iVar6 = btreeComputeFreeSpace(pPage_00), iVar6 != 0)) {
            return iVar6;
          }
          ppMVar11 = &pCur->pPage;
          if ((int)local_50 < pCur->iPage + -1) {
            ppMVar11 = pCur->apPage + local_50 + 1;
          }
          uVar10 = (uint)(CONCAT11(pPage_00->aCellIdx[(ulong)pPage_00->nCell * 2 + -2],
                                   pPage_00->aCellIdx[(ulong)pPage_00->nCell * 2 + -1]) &
                         pPage_00->maskPage);
          if (uVar10 < 4) {
            iVar6 = sqlite3CorruptError(0x13a10);
            return iVar6;
          }
          local_5c = (*ppMVar11)->pgno;
          puVar9 = pPage_00->aData;
          uVar5 = (*pPage_00->xCellSize)(pPage_00,puVar9 + uVar10);
          local_58 = (ulong)uVar5;
          pTemp = pBt->pTmpSpace;
          local_74 = sqlite3PagerWrite(pPage_00->pDbPage);
          if (local_74 == 0) {
            local_74 = insertCell(pPage,(uint)uVar1,puVar9 + uVar10 + -4,(int)local_58 + 4,pTemp,
                                  local_5c);
          }
          dropCell(pPage_00,pPage_00->nCell - 1,(int)local_58,&local_74);
          lVar12 = local_50;
          if (local_74 != 0) {
            return local_74;
          }
        }
        uVar10 = local_70;
        if ((pCur->pPage->nFree * 3 <= (int)(pCur->pBt->usableSize * 2)) ||
           (iVar6 = balance(pCur), iVar6 == 0)) {
          if ((char)lVar12 < pCur->iPage) {
            releasePageNotNull(pCur->pPage);
            iVar6 = local_6c;
            cVar3 = pCur->iPage + -1;
            pCur->iPage = cVar3;
            while ((char)iVar6 < cVar3) {
              pCur->iPage = cVar3 + -1;
              releasePage(pCur->apPage[cVar3]);
              cVar3 = pCur->iPage;
            }
            pCur->pPage = pCur->apPage[cVar3];
            iVar6 = balance(pCur);
            if (iVar6 != 0) {
              return iVar6;
            }
          }
          if ((char)local_68 == '\0') {
            iVar8 = moveToRoot(pCur);
            if ((uVar10 & 2) != 0) {
              btreeReleaseAllCursorPages(pCur);
              pCur->eState = '\x03';
            }
            iVar6 = 0;
            if (iVar8 != 0x10) {
              iVar6 = iVar8;
            }
          }
          else {
            pCur->eState = '\x02';
            uVar4 = pPage->nCell;
            if (uVar1 < uVar4) {
              pCur->skipNext = 1;
            }
            else {
              pCur->skipNext = -1;
              pCur->ix = uVar4 - 1;
            }
            iVar6 = 0;
          }
        }
      }
    }
  }
  return iVar6;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeDelete(BtCursor *pCur, u8 flags){
  Btree *p = pCur->pBtree;
  BtShared *pBt = p->pBt;
  int rc;                    /* Return code */
  MemPage *pPage;            /* Page to delete cell from */
  unsigned char *pCell;      /* Pointer to cell to delete */
  int iCellIdx;              /* Index of cell to delete */
  int iCellDepth;            /* Depth of node containing pCell */
  CellInfo info;             /* Size of the cell being deleted */
  u8 bPreserve;              /* Keep cursor valid.  2 for CURSOR_SKIPNEXT */

  assert( cursorOwnsBtShared(pCur) );
  assert( pBt->inTransaction==TRANS_WRITE );
  assert( (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( pCur->curFlags & BTCF_WriteFlag );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );
  assert( !hasReadConflicts(p, pCur->pgnoRoot) );
  assert( (flags & ~(BTREE_SAVEPOSITION | BTREE_AUXDELETE))==0 );
  if( pCur->eState!=CURSOR_VALID ){
    if( pCur->eState>=CURSOR_REQUIRESEEK ){
      rc = btreeRestoreCursorPosition(pCur);
      assert( rc!=SQLITE_OK || CORRUPT_DB || pCur->eState==CURSOR_VALID );
      if( rc || pCur->eState!=CURSOR_VALID ) return rc;
    }else{
      return SQLITE_CORRUPT_PGNO(pCur->pgnoRoot);
    }
  }
  assert( pCur->eState==CURSOR_VALID );

  iCellDepth = pCur->iPage;
  iCellIdx = pCur->ix;
  pPage = pCur->pPage;
  if( pPage->nCell<=iCellIdx ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  pCell = findCell(pPage, iCellIdx);
  if( pPage->nFree<0 && btreeComputeFreeSpace(pPage) ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  if( pCell<&pPage->aCellIdx[pPage->nCell] ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }

  /* If the BTREE_SAVEPOSITION bit is on, then the cursor position must
  ** be preserved following this delete operation. If the current delete
  ** will cause a b-tree rebalance, then this is done by saving the cursor
  ** key and leaving the cursor in CURSOR_REQUIRESEEK state before
  ** returning.
  **
  ** If the current delete will not cause a rebalance, then the cursor
  ** will be left in CURSOR_SKIPNEXT state pointing to the entry immediately
  ** before or after the deleted entry.
  **
  ** The bPreserve value records which path is required:
  **
  **    bPreserve==0         Not necessary to save the cursor position
  **    bPreserve==1         Use CURSOR_REQUIRESEEK to save the cursor position
  **    bPreserve==2         Cursor won't move.  Set CURSOR_SKIPNEXT.
  */
  bPreserve = (flags & BTREE_SAVEPOSITION)!=0;
  if( bPreserve ){
    if( !pPage->leaf
     || (pPage->nFree+pPage->xCellSize(pPage,pCell)+2) >
                                                   (int)(pBt->usableSize*2/3)
     || pPage->nCell==1  /* See dbfuzz001.test for a test case */
    ){
      /* A b-tree rebalance will be required after deleting this entry.
      ** Save the cursor key.  */
      rc = saveCursorKey(pCur);
      if( rc ) return rc;
    }else{
      bPreserve = 2;
    }
  }

  /* If the page containing the entry to delete is not a leaf page, move
  ** the cursor to the largest entry in the tree that is smaller than
  ** the entry being deleted. This cell will replace the cell being deleted
  ** from the internal node. The 'previous' entry is used for this instead
  ** of the 'next' entry, as the previous entry is always a part of the
  ** sub-tree headed by the child page of the cell being deleted. This makes
  ** balancing the tree following the delete operation easier.  */
  if( !pPage->leaf ){
    rc = sqlite3BtreePrevious(pCur, 0);
    assert( rc!=SQLITE_DONE );
    if( rc ) return rc;
  }

  /* Save the positions of any other cursors open on this table before
  ** making any modifications.  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
  }

  /* If this is a delete operation to remove a row from a table b-tree,
  ** invalidate any incrblob cursors open on the row being deleted.  */
  if( pCur->pKeyInfo==0 && p->hasIncrblobCur ){
    invalidateIncrblobCursors(p, pCur->pgnoRoot, pCur->info.nKey, 0);
  }

  /* Make the page containing the entry to be deleted writable. Then free any
  ** overflow pages associated with the entry and finally remove the cell
  ** itself from within the page.  */
  rc = sqlite3PagerWrite(pPage->pDbPage);
  if( rc ) return rc;
  BTREE_CLEAR_CELL(rc, pPage, pCell, info);
  dropCell(pPage, iCellIdx, info.nSize, &rc);
  if( rc ) return rc;

  /* If the cell deleted was not located on a leaf page, then the cursor
  ** is currently pointing to the largest entry in the sub-tree headed
  ** by the child-page of the cell that was just deleted from an internal
  ** node. The cell from the leaf node needs to be moved to the internal
  ** node to replace the deleted cell.  */
  if( !pPage->leaf ){
    MemPage *pLeaf = pCur->pPage;
    int nCell;
    Pgno n;
    unsigned char *pTmp;

    if( pLeaf->nFree<0 ){
      rc = btreeComputeFreeSpace(pLeaf);
      if( rc ) return rc;
    }
    if( iCellDepth<pCur->iPage-1 ){
      n = pCur->apPage[iCellDepth+1]->pgno;
    }else{
      n = pCur->pPage->pgno;
    }
    pCell = findCell(pLeaf, pLeaf->nCell-1);
    if( pCell<&pLeaf->aData[4] ) return SQLITE_CORRUPT_PAGE(pLeaf);
    nCell = pLeaf->xCellSize(pLeaf, pCell);
    assert( MX_CELL_SIZE(pBt) >= nCell );
    pTmp = pBt->pTmpSpace;
    assert( pTmp!=0 );
    rc = sqlite3PagerWrite(pLeaf->pDbPage);
    if( rc==SQLITE_OK ){
      rc = insertCell(pPage, iCellIdx, pCell-4, nCell+4, pTmp, n);
    }
    dropCell(pLeaf, pLeaf->nCell-1, nCell, &rc);
    if( rc ) return rc;
  }

  /* Balance the tree. If the entry deleted was located on a leaf page,
  ** then the cursor still points to that page. In this case the first
  ** call to balance() repairs the tree, and the if(...) condition is
  ** never true.
  **
  ** Otherwise, if the entry deleted was on an internal node page, then
  ** pCur is pointing to the leaf page from which a cell was removed to
  ** replace the cell deleted from the internal node. This is slightly
  ** tricky as the leaf node may be underfull, and the internal node may
  ** be either under or overfull. In this case run the balancing algorithm
  ** on the leaf node first. If the balance proceeds far enough up the
  ** tree that we can be sure that any problem in the internal node has
  ** been corrected, so be it. Otherwise, after balancing the leaf node,
  ** walk the cursor up the tree to the internal node and balance it as
  ** well.  */
  assert( pCur->pPage->nOverflow==0 );
  assert( pCur->pPage->nFree>=0 );
  if( pCur->pPage->nFree*3<=(int)pCur->pBt->usableSize*2 ){
    /* Optimization: If the free space is less than 2/3rds of the page,
    ** then balance() will always be a no-op.  No need to invoke it. */
    rc = SQLITE_OK;
  }else{
    rc = balance(pCur);
  }
  if( rc==SQLITE_OK && pCur->iPage>iCellDepth ){
    releasePageNotNull(pCur->pPage);
    pCur->iPage--;
    while( pCur->iPage>iCellDepth ){
      releasePage(pCur->apPage[pCur->iPage--]);
    }
    pCur->pPage = pCur->apPage[pCur->iPage];
    rc = balance(pCur);
  }

  if( rc==SQLITE_OK ){
    if( bPreserve>1 ){
      assert( (pCur->iPage==iCellDepth || CORRUPT_DB) );
      assert( pPage==pCur->pPage || CORRUPT_DB );
      assert( (pPage->nCell>0 || CORRUPT_DB) && iCellIdx<=pPage->nCell );
      pCur->eState = CURSOR_SKIPNEXT;
      if( iCellIdx>=pPage->nCell ){
        pCur->skipNext = -1;
        pCur->ix = pPage->nCell-1;
      }else{
        pCur->skipNext = 1;
      }
    }else{
      rc = moveToRoot(pCur);
      if( bPreserve ){
        btreeReleaseAllCursorPages(pCur);
        pCur->eState = CURSOR_REQUIRESEEK;
      }
      if( rc==SQLITE_EMPTY ) rc = SQLITE_OK;
    }
  }
  return rc;
}